

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall r_exec::TDecompiler::runDecompiler(TDecompiler *this)

{
  thread *this_00;
  TDecompiler *local_68;
  code *local_60;
  undefined8 local_58;
  allocator local_39;
  string local_38 [39];
  string local_11;
  TDecompiler *local_10;
  TDecompiler *this_local;
  
  local_10 = this;
  if (this->metadata == (Metadata *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"tdecompiler",&local_39);
    ::debug(&local_11);
    DebugStream::operator<<((DebugStream *)&local_11,"unable to run without metadata");
    DebugStream::~DebugStream((DebugStream *)&local_11);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    this_00 = (thread *)operator_new(8);
    local_60 = decompile;
    local_58 = 0;
    local_68 = this;
    std::thread::thread<void(r_exec::TDecompiler::*)(),r_exec::TDecompiler*,void>
              (this_00,(type *)&local_60,&local_68);
    this->_thread = this_00;
  }
  return;
}

Assistant:

void TDecompiler::runDecompiler()
{
    if (!metadata) {
        debug("tdecompiler") << "unable to run without metadata";
        return;
    }

    _thread = new std::thread(&r_exec::TDecompiler::decompile, this);
}